

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O1

void __thiscall
trieste::detail::Choice<true>::Choice(Choice<true> *this,PatternPtr *first_,PatternPtr *second_)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  runtime_error *this_00;
  
  (this->super_PatternDef).continuation.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_PatternDef).continuation.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PatternDef)._vptr_PatternDef = (_func_int **)&PTR__Choice_002a4188;
  (this->first).super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (first_->super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (first_->super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->first).super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->second).super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (second_->super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
  p_Var1 = (second_->super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->second).super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  bVar2 = PatternDef::has_captures
                    ((this->first).
                     super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  if (bVar2) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Static and dynamic view of captures disagree.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Choice(PatternPtr first_, PatternPtr second_)
      : first(first_), second(second_)
      {
        if (CapturesLeft != first->has_captures())
          throw std::runtime_error(
            "Static and dynamic view of captures disagree.");
      }